

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O1

void kokkosp_print_help(char *exe)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
  if (exe == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13a268);
  }
  else {
    sVar1 = strlen(exe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,exe,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[--kokkos-tools-args=<threshold>]\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nDefault value: 0.1\n\nDescription:\n  Provide a decimal threshold value of percent of parent time for output.  \n  Timers below this threshold will not be output.  Set to 0 to get unfiltered\n  reports.\n\nExample:\n  The following example would set the threshold to 10%\n    <exe> [--kokkos-tools-args=10 ]\n"
             ,300);
  return;
}

Assistant:

void kokkosp_print_help(const char* exe) {
  auto usage = R"usage(
Default value: 0.1

Description:
  Provide a decimal threshold value of percent of parent time for output.  
  Timers below this threshold will not be output.  Set to 0 to get unfiltered
  reports.

Example:
  The following example would set the threshold to 10%
    <exe> [--kokkos-tools-args=10 ]
)usage";
  std::cout << "usage: " << exe << "[--kokkos-tools-args=<threshold>]\n"
            << usage;
}